

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O3

cse_abstract * __thiscall
factory_item<xray_re::se_weapon_shotgun>::create(factory_item<xray_re::se_weapon_shotgun> *this)

{
  cse_abstract *this_00;
  
  this_00 = (cse_abstract *)operator_new(0x230);
  xray_re::cse_alife_item_weapon_magazined::cse_alife_item_weapon_magazined
            ((cse_alife_item_weapon_magazined *)this_00);
  this_00[2].m_version = 0;
  this_00[2].m_script_version = 0;
  this_00[2].m_respawn_time = 0;
  this_00[2].m_id = 0;
  this_00[2].m_id_parent = 0;
  this_00[2].m_id_phantom = 0;
  *(undefined4 *)&this_00[2].field_0x34 = 0;
  this_00[2].m_s_name._M_dataplus._M_p = (pointer)0x0;
  (((cse_alife_item_weapon *)&this_00->_vptr_cse_abstract)->super_cse_alife_item).
  super_cse_alife_dynamic_object_visual.super_cse_alife_dynamic_object.super_cse_alife_object.
  super_cse_abstract._vptr_cse_abstract = (_func_int **)&PTR__cse_alife_item_weapon_shotgun_0024cfe0
  ;
  *(undefined ***)((long)&this_00[1].m_s_name_replace.field_2 + 8) =
       &PTR__se_weapon_shotgun_0024d048;
  *(undefined ***)((long)&this_00[1].m_o_angle.field_0 + 4) = &PTR__se_weapon_shotgun_0024d070;
  (this_00->m_clsid).field_0 = (this->super_factory_item_base).m_clsid.field_0;
  return this_00;
}

Assistant:

cse_abstract* factory_item<T>::create()
{
	T* p = new T;
	p->clsid() = clsid();
	return p;
}